

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O2

int dasm_link(BuildCtx *ctx,size_t *szp)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  dasm_State *pdVar4;
  int *piVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  int idx;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  int *local_50;
  
  pdVar4 = ctx->D;
  *szp = 0;
  iVar16 = pdVar4->status;
  if (iVar16 == 0) {
    uVar7 = 0;
    for (uVar11 = 0; uVar11 < pdVar4->pcsize; uVar11 = uVar11 + 4) {
      if (0 < *(int *)((long)pdVar4->pclabels + uVar11)) {
        return uVar7 | 0x22000000;
      }
      uVar7 = uVar7 + 1;
    }
    uVar11 = pdVar4->lgsize;
    for (lVar12 = 10; (ulong)(lVar12 * 4) < uVar11; lVar12 = lVar12 + 1) {
      uVar7 = pdVar4->lglabels[lVar12];
      while (0 < (int)uVar7) {
        piVar5 = pdVar4->sections[uVar7 >> 0x18].rbuf;
        uVar2 = piVar5[uVar7];
        piVar5[uVar7] = -(int)lVar12;
        uVar7 = uVar2;
      }
    }
    local_50 = &pdVar4->sections[0].ofs;
    iVar16 = 0;
    for (uVar11 = 0; (long)uVar11 < (long)pdVar4->maxsection; uVar11 = uVar11 + 1) {
      piVar5 = pdVar4->sections[uVar11].rbuf;
      iVar17 = (int)uVar11 << 0x18;
      iVar3 = pdVar4->sections[uVar11].pos;
LAB_00105b47:
      if (iVar17 != iVar3) {
        pbVar19 = pdVar4->actionlist + piVar5[iVar17];
        iVar17 = iVar17 + 1;
        bVar6 = 0;
switchD_00105b86_caseD_fd:
        do {
          bVar10 = bVar6;
          pbVar18 = pbVar19;
          pbVar19 = pbVar18 + 1;
          bVar1 = *pbVar18;
          bVar6 = bVar1;
        } while (0x16 < bVar1 - 0xe9);
        bVar6 = bVar10;
        switch((uint)bVar1) {
        case 0xf0:
        case 0xf1:
        case 0xf6:
          pbVar19 = pbVar18 + 2;
        default:
          iVar17 = iVar17 + 1;
          goto switchD_00105b86_caseD_fd;
        case 0xf4:
          pbVar19 = pbVar18 + 2;
        case 0xf5:
          iVar8 = (uint)((bVar10 & 0xf0) == 0x80) << 2;
          if (bVar10 == 0xe9) {
            iVar8 = 3;
          }
          iVar9 = 0;
          if (iVar8 != 0) {
            uVar7 = piVar5[iVar17];
            if (-1 < (int)uVar7) {
              iVar14 = pdVar4->sections[uVar7 >> 0x18].rbuf[uVar7];
              if (iVar17 < (int)uVar7) {
                uVar13 = (ulong)(uVar7 >> 0x18);
                piVar15 = local_50;
                if (uVar7 >> 0x18 < uVar11) {
                  uVar13 = uVar11;
                }
                for (; uVar11 != uVar13; uVar13 = uVar13 - 1) {
                  iVar14 = iVar14 + *piVar15;
                  piVar15 = piVar15 + 10;
                }
              }
              else {
                iVar14 = iVar14 - iVar16;
              }
              iVar9 = iVar8;
              if (0x7f < iVar14 - piVar5[(long)iVar17 + 1]) {
                iVar9 = 0;
              }
              if (iVar14 - piVar5[(long)iVar17 + 1] < -0x80 - iVar8) {
                iVar9 = 0;
              }
              iVar16 = iVar16 - iVar9;
            }
          }
          piVar5[(long)iVar17 + 1] = iVar9;
          iVar17 = iVar17 + 2;
          goto switchD_00105b86_caseD_fd;
        case 0xf8:
          pbVar19 = pbVar18 + 2;
        case 0xf9:
          piVar5[iVar17] = piVar5[iVar17] + iVar16;
          iVar17 = iVar17 + 1;
          goto switchD_00105b86_caseD_fd;
        case 0xfa:
          iVar16 = iVar16 - ((uint)pbVar18[1] & piVar5[iVar17] + iVar16);
          pbVar19 = pbVar18 + 2;
          iVar17 = iVar17 + 1;
          goto switchD_00105b86_caseD_fd;
        case 0xfb:
          pbVar19 = pbVar18 + 3;
          goto switchD_00105b86_caseD_fd;
        case 0xfc:
          pbVar19 = pbVar18 + 2;
          bVar6 = pbVar18[1];
        case 0xfd:
          goto switchD_00105b86_caseD_fd;
        case 0xfe:
        case 0xff:
          goto switchD_00105b86_caseD_fe;
        }
      }
      iVar16 = iVar16 + pdVar4->sections[uVar11].ofs;
      local_50 = local_50 + 10;
    }
    pdVar4->codesize = (long)iVar16;
    *szp = (long)iVar16;
    iVar16 = 0;
  }
  return iVar16;
switchD_00105b86_caseD_fe:
  goto LAB_00105b47;
}

Assistant:

int dasm_link(Dst_DECL, size_t *szp)
{
  dasm_State *D = Dst_REF;
  int secnum;
  int ofs = 0;

#ifdef DASM_CHECKS
  *szp = 0;
  if (D->status != DASM_S_OK) return D->status;
  {
    int pc;
    for (pc = 0; pc*sizeof(int) < D->pcsize; pc++)
      if (D->pclabels[pc] > 0) return DASM_S_UNDEF_PC|pc;
  }
#endif

  { /* Handle globals not defined in this translation unit. */
    int idx;
    for (idx = 10; idx*sizeof(int) < D->lgsize; idx++) {
      int n = D->lglabels[idx];
      /* Undefined label: Collapse rel chain and replace with marker (< 0). */
      while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = -idx; }
    }
  }

  /* Combine all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->rbuf;
    int pos = DASM_SEC2POS(secnum);
    int lastpos = sec->pos;

    while (pos != lastpos) {
      dasm_ActList p = D->actionlist + b[pos++];
      int op = 0;
      while (1) {
	int action = *p++;
	switch (action) {
	case DASM_REL_LG: p++;
	  /* fallthrough */
	case DASM_REL_PC: {
	  int shrink = op == 0xe9 ? 3 : ((op&0xf0) == 0x80 ? 4 : 0);
	  if (shrink) {  /* Shrinkable branch opcode? */
	    int lofs, lpos = b[pos];
	    if (lpos < 0) goto noshrink;  /* Ext global? */
	    lofs = *DASM_POS2PTR(D, lpos);
	    if (lpos > pos) {  /* Fwd label: add cumulative section offsets. */
	      int i;
	      for (i = secnum; i < DASM_POS2SEC(lpos); i++)
		lofs += D->sections[i].ofs;
	    } else {
	      lofs -= ofs;  /* Bkwd label: unfix offset. */
	    }
	    lofs -= b[pos+1];  /* Short branch ok? */
	    if (lofs >= -128-shrink && lofs <= 127) ofs -= shrink;  /* Yes. */
	    else { noshrink: shrink = 0; }  /* No, cannot shrink op. */
	  }
	  b[pos+1] = shrink;
	  pos += 2;
	  break;
	}
	  /* fallthrough */
	case DASM_SPACE: case DASM_IMM_LG: case DASM_VREG: p++;
	  /* fallthrough */
	case DASM_DISP: case DASM_IMM_S: case DASM_IMM_B: case DASM_IMM_W:
	case DASM_IMM_D: case DASM_IMM_WB: case DASM_IMM_DB:
	case DASM_SETLABEL: case DASM_REL_A: case DASM_IMM_PC: pos++; break;
	case DASM_LABEL_LG: p++;
	  /* fallthrough */
	case DASM_LABEL_PC: b[pos++] += ofs; break; /* Fix label offset. */
	case DASM_ALIGN: ofs -= (b[pos++]+ofs)&*p++; break; /* Adjust ofs. */
	case DASM_EXTERN: p += 2; break;
	case DASM_ESC: op = *p++; break;
	case DASM_MARK: break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	default: op = action; break;
	}
      }
      stop: (void)0;
    }
    ofs += sec->ofs;  /* Next section starts right after current section. */
  }

  D->codesize = ofs;  /* Total size of all code sections */
  *szp = ofs;
  return DASM_S_OK;
}